

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall
MlmWrap::route_mailbox_msgs
          (MlmWrap *this,char *address,char *sender,char *subject,char *tracker,zmsg_t *msg)

{
  char *__ptr;
  char *format_00;
  TrodesMsg m;
  string format;
  string sStack_98;
  TrodesMsg local_78;
  string local_50 [32];
  
  format_00 = subject;
  __ptr = zmsg_popstr(msg);
  std::__cxx11::string::string(local_50,__ptr,(allocator *)&local_78);
  free(__ptr);
  std::__cxx11::string::string((string *)&sStack_98,local_50);
  TrodesMsg::TrodesMsg(&local_78,&sStack_98,msg);
  std::__cxx11::string::~string((string *)&sStack_98);
  receiveMailbox(this,sender,subject,format_00,&local_78);
  TrodesMsg::~TrodesMsg(&local_78);
  std::__cxx11::string::~string(local_50);
  return 0;
}

Assistant:

int MlmWrap::route_mailbox_msgs(const char *address, const char *sender, const char *subject, const char *tracker, zmsg_t *msg){
    char *f = zmsg_popstr(msg);
    std::string format = f;
    freen(f);

    TrodesMsg m(format, msg);
    receiveMailbox(sender, subject, format.c_str(), m);
    return 0;
}